

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O0

int lj_sysprof_stop(lua_State *L)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long in_RDI;
  int cb_status;
  lj_wbuf *out;
  global_State *g;
  sysprof *sp;
  lj_wbuf *buf;
  int local_4;
  
  buf = &sysprof.out;
  if (sysprof.state == 0) {
    local_4 = 2;
  }
  else if ((global_State *)(ulong)*(uint *)(in_RDI + 8) == sysprof.g) {
    lj_profile_timer_stop((lj_profile_timer *)sysprof.g);
    iVar1 = sysprof.saved_errno;
    if (sysprof.state == 2) {
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      sysprof.state = 0;
      local_4 = 4;
    }
    else {
      sysprof.state = 0;
      iVar1 = stream_is_needed(&sysprof);
      if (iVar1 != 0) {
        stream_epilogue((sysprof *)0x152e9f);
        lj_wbuf_flush(buf);
        iVar1 = (*sysprof.on_stop)(sysprof.opt.ctx,buf->buf);
        iVar2 = lj_wbuf_test_flag(buf,'\x03');
        if ((iVar2 != 0) || (iVar1 != 0)) {
          iVar1 = lj_wbuf_errno(buf);
          piVar3 = __errno_location();
          *piVar3 = iVar1;
          lj_wbuf_terminate((lj_wbuf *)0x152f20);
          return 4;
        }
        lj_wbuf_terminate((lj_wbuf *)0x152f34);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int lj_sysprof_stop(lua_State *L)
{
  struct sysprof *sp = &sysprof;
  global_State *g = sp->g;
  struct lj_wbuf *out = &sp->out;

  if (SPS_IDLE == sp->state)
    return PROFILE_ERRRUN;
  else if (G(L) != g)
    return PROFILE_ERRUSE;

  lj_profile_timer_stop(&sp->timer);

  if (SPS_HALT == sp->state) {
    errno = sp->saved_errno;
    sp->state = SPS_IDLE;
    /* wbuf was terminated when error occurred. */
    return PROFILE_ERRIO;
  }

  sp->state = SPS_IDLE;

  if (stream_is_needed(sp)) {
    int cb_status = 0;

    stream_epilogue(sp);
    lj_wbuf_flush(out);

    cb_status = sp->on_stop(sp->opt.ctx, out->buf);
    if (LJ_UNLIKELY(lj_wbuf_test_flag(out, STREAM_ERRIO | STREAM_STOP)) ||
        cb_status != 0) {
      errno = lj_wbuf_errno(out);
      lj_wbuf_terminate(out);
      return PROFILE_ERRIO;
    }

    lj_wbuf_terminate(out);
  }

  return PROFILE_SUCCESS;
}